

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cc
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  double dVar4;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar5;
  int stationID;
  double tof;
  Vector3d vel2;
  Vector3d pos2;
  Vector3d vel1;
  Vector3d pos1;
  int i_1;
  Vector3d obs_station_iter;
  double c;
  Vector3d obs_station3;
  Vector3d obs_station2;
  Vector3d obs_station1;
  MatrixXd pred_meas;
  MatrixXd true_meas;
  MatrixXd lighttime_truth;
  Vector3d velf_true;
  Vector3d posf_true;
  Vector3d vel0;
  Vector3d pos0;
  EGM96Grav gravmodel;
  Propagator propobj;
  int i;
  MatrixXd pos_ECI2;
  Vector3d pos_ECEF2;
  MatrixXd t_R_test;
  Vector3d pos_ECI;
  Matrix3d R;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  matvec;
  double t_JD;
  MatrixXd iau1980;
  MatrixXd nut80;
  Vector3d targ_pos_ECI;
  Vector3d pos_ECEF;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffff3c8;
  Propagator *in_stack_fffffffffffff3d0;
  EGM96Grav *this;
  allocator_type *in_stack_fffffffffffff3d8;
  undefined4 in_stack_fffffffffffff3e0;
  int in_stack_fffffffffffff3e4;
  Scalar *in_stack_fffffffffffff3e8;
  EGM96Grav *in_stack_fffffffffffff3f0;
  ostream *in_stack_fffffffffffff3f8;
  ostream *in_stack_fffffffffffff400;
  ostream *in_stack_fffffffffffff408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff410;
  double *in_stack_fffffffffffff418;
  double in_stack_fffffffffffff420;
  EGM96Grav *in_stack_fffffffffffff440;
  string *in_stack_fffffffffffff470;
  string *in_stack_fffffffffffff478;
  EGM96Grav *in_stack_fffffffffffff480;
  undefined1 local_a89 [133];
  int local_a04;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff618;
  ostream *in_stack_fffffffffffff620;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffff628;
  string *in_stack_fffffffffffff630;
  int in_stack_fffffffffffff820;
  int in_stack_fffffffffffff824;
  string *in_stack_fffffffffffff828;
  int local_7a4;
  allocator<char> local_6b9;
  string local_6b8 [63];
  allocator<char> local_679;
  string local_678 [56];
  undefined8 local_640;
  undefined8 local_638;
  undefined8 local_630;
  undefined8 local_610;
  undefined8 local_608;
  undefined8 local_600;
  double in_stack_fffffffffffffa08;
  Vector3d *in_stack_fffffffffffffa10;
  Propagator *in_stack_fffffffffffffa18;
  allocator<char> local_5a9;
  string local_5a8 [39];
  allocator<char> local_581;
  string local_580 [32];
  undefined8 local_560;
  double local_558;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  undefined1 local_4e0;
  undefined1 local_4df;
  undefined1 local_4de;
  undefined1 local_4dd;
  undefined1 local_4dc;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 local_428;
  double local_420;
  double local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  double local_3f8;
  double local_3f0;
  undefined8 local_3e8;
  undefined8 *local_3e0;
  Scalar local_3d8;
  double local_3d0;
  undefined8 local_3c8;
  double local_3c0;
  double local_3b8;
  allocator<char> local_389;
  string local_388 [88];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_330;
  int local_2d4;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  allocator<char> local_269;
  string local_268 [80];
  undefined8 local_218;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_1d8;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffffe80;
  MatrixXd *in_stack_fffffffffffffe88;
  MatrixXd *in_stack_fffffffffffffe90;
  double in_stack_fffffffffffffe98;
  allocator<char> local_f1;
  string local_f0 [32];
  undefined1 local_d0 [47];
  allocator<char> local_a1;
  string local_a0 [32];
  undefined1 local_80 [24];
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_8 = (int)std::setprecision(0x11);
  std::operator<<((ostream *)&std::cout,(_Setprecision)local_8);
  local_28 = 0xc0dc10949906cca3;
  local_30 = 0xc0de1f04a0e410b6;
  local_38 = 0xc01adf3b645a1cac;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff400,
             (Scalar *)in_stack_fffffffffffff3f8,&in_stack_fffffffffffff3f0->mu_,
             in_stack_fffffffffffff3e8);
  local_58 = 0x40d2b75c7d4d1be5;
  local_60 = 0xc0e255a1f704fa5b;
  local_68 = 0xc044859502c2d3b4;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff400,
             (Scalar *)in_stack_fffffffffffff3f8,&in_stack_fffffffffffff3f0->mu_,
             in_stack_fffffffffffff3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (allocator<char> *)in_stack_fffffffffffff400);
  Util::LoadDatFile(in_stack_fffffffffffff828,in_stack_fffffffffffff824,in_stack_fffffffffffff820);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (allocator<char> *)in_stack_fffffffffffff400);
  Util::LoadDatFile(in_stack_fffffffffffff828,in_stack_fffffffffffff824,in_stack_fffffffffffff820);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  dVar4 = Util::JulianDateNatural2JD
                    (in_stack_fffffffffffff420,(double)in_stack_fffffffffffff418,
                     (double)in_stack_fffffffffffff410,(double)in_stack_fffffffffffff408,
                     (double)in_stack_fffffffffffff400,(double)in_stack_fffffffffffff3f8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Julian Date: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar4);
  std::operator<<(poVar1,"\n");
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity
            ((Index)in_stack_fffffffffffff3f8,(Index)in_stack_fffffffffffff3f0);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff3d0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffff3c8);
  std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::allocator
            ((allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x104d66);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)in_stack_fffffffffffff3f0,(size_type)in_stack_fffffffffffff3e8,
           (value_type *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
           in_stack_fffffffffffff3d8);
  std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x104d97);
  Util::ECEF2ECI(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 in_stack_fffffffffffffe80);
  local_1d8 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_fffffffffffff3d0,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_fffffffffffff3c8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)in_stack_fffffffffffff3c8);
  std::operator<<((ostream *)&std::cout,"Error [cm]: \n");
  local_218 = 0x40f86a0000000000;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff3f8,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff3f0);
  Eigen::operator*(in_stack_fffffffffffff418,(StorageBaseType *)in_stack_fffffffffffff410);
  poVar1 = Eigen::operator<<((ostream *)in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  std::operator<<(poVar1,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (allocator<char> *)in_stack_fffffffffffff400);
  Util::LoadDatFile(in_stack_fffffffffffff828,in_stack_fffffffffffff824,in_stack_fffffffffffff820);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  local_290 = 0x40b8ea22e48e8a72;
  local_298 = 0x40b8ea22e48e8a72;
  local_2a0 = 0x40b8ea22e48e8a72;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff400,
             (Scalar *)in_stack_fffffffffffff3f8,&in_stack_fffffffffffff3f0->mu_,
             in_stack_fffffffffffff3e8);
  std::operator<<((ostream *)&std::cout,"ECEF Test Position: \n");
  poVar1 = Eigen::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  std::operator<<(poVar1,"\n");
  Util::JulianDateNatural2JD
            (in_stack_fffffffffffff420,(double)in_stack_fffffffffffff418,
             (double)in_stack_fffffffffffff410,(double)in_stack_fffffffffffff408,
             (double)in_stack_fffffffffffff400,(double)in_stack_fffffffffffff3f8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_fffffffffffff3d8,(Index)in_stack_fffffffffffff3d0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff3d0,
             in_stack_fffffffffffff3c8);
  for (local_2d4 = 0; local_2d4 < 0x361; local_2d4 = local_2d4 + 1) {
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
               in_stack_fffffffffffff3d0,(Index)in_stack_fffffffffffff3c8,0x105094);
    Util::ECEF2ECI(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe80);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff3d0,
               (Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff3c8);
    PVar5 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffff3d0,
                       (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       in_stack_fffffffffffff3c8);
    local_330 = PVar5;
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff410,
               (Index)in_stack_fffffffffffff408,(Index)in_stack_fffffffffffff400,
               (int)((ulong)in_stack_fffffffffffff3f8 >> 0x20),(int)in_stack_fffffffffffff3f8);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
               in_stack_fffffffffffff3d0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_fffffffffffff3c8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (allocator<char> *)in_stack_fffffffffffff400);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff3d0,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff3c8);
  Util::Eigen2csv(in_stack_fffffffffffff630,(MatrixXd *)in_stack_fffffffffffff628);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x10537f);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator(&local_389);
  VehicleState::Propagator::Propagator(in_stack_fffffffffffff3d0);
  local_450 = 0x41185421c4189375;
  local_448 = 0x423ee64720d20000;
  local_440 = 0x40b326ccd12018a4;
  local_438 = 0x41a1d55d5d666666;
  local_430 = 0x3f51bc400cb5700f;
  local_428 = 0x3ec53eee8cc1ee17;
  local_420 = 6378.1363;
  local_418 = pow(10.0,-5.0);
  local_418 = local_418 * 7.292115146706979;
  local_410 = 0x3ffe147ae147ae14;
  local_408 = 0x402e000000000000;
  local_400 = 0x409f400000000000;
  local_3f8 = pow(10.0,-13.0);
  local_3f8 = local_3f8 * 3.614;
  local_3f0 = local_420 + 700.0;
  local_3e8 = 0x40562ab020c49ba6;
  local_4e0 = 0;
  local_4dc = 1;
  local_4df = 0;
  local_4de = 0;
  local_4dd = 0;
  Util::EGM96Grav::EGM96Grav(in_stack_fffffffffffff3f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (allocator<char> *)in_stack_fffffffffffff400);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (allocator<char> *)in_stack_fffffffffffff400);
  Util::EGM96Grav::LoadNormCoeffs
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,in_stack_fffffffffffff470);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator(&local_581);
  Util::EGM96Grav::NormCoeffs2Reg(in_stack_fffffffffffff440);
  local_560 = local_450;
  local_558 = local_420;
  local_4f0 = local_80;
  local_4e8 = local_d0;
  local_3e0 = &local_560;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x10564d);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff3d0,(Index)in_stack_fffffffffffff3c8);
  *pSVar2 = 6984.46459301679;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff3d0,(Index)in_stack_fffffffffffff3c8);
  *pSVar2 = 1612.22237259524;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff3d0,(Index)in_stack_fffffffffffff3c8);
  *pSVar2 = 13.0914313353482;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1056ee);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff3d0,(Index)in_stack_fffffffffffff3c8);
  *pSVar2 = -1.67664476668291;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff3d0,(Index)in_stack_fffffffffffff3c8);
  *pSVar2 = 7.26144494619245;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff3d0,(Index)in_stack_fffffffffffff3c8);
  *pSVar2 = 0.259889921085112;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8);
  local_3d0 = Util::JulianDateNatural2JD
                        (in_stack_fffffffffffff420,(double)in_stack_fffffffffffff418,
                         (double)in_stack_fffffffffffff410,(double)in_stack_fffffffffffff408,
                         (double)in_stack_fffffffffffff400,(double)in_stack_fffffffffffff3f8);
  local_3b8 = pow(10.0,-16.0);
  local_3c0 = pow(10.0,-14.0);
  local_3c0 = local_3c0 * 3.0;
  local_3c8 = 0x3fb999999999999a;
  local_600 = 0xc0b421c59cda89e2;
  local_608 = 0xc0b35a6f920798ca;
  local_610 = 0xc0621aa6704c737c;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff400,
             (Scalar *)in_stack_fffffffffffff3f8,&in_stack_fffffffffffff3f0->mu_,
             in_stack_fffffffffffff3e8);
  local_630 = 0x4014b65ae35a1114;
  local_638 = 0xc0158cc52ab50d59;
  local_640 = 0xbfcb207c344d093b;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff400,
             (Scalar *)in_stack_fffffffffffff3f8,&in_stack_fffffffffffff3f0->mu_,
             in_stack_fffffffffffff3e8);
  local_4e0 = 1;
  local_4dc = 1;
  local_4df = 1;
  local_4de = 1;
  local_4dd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (allocator<char> *)in_stack_fffffffffffff400);
  Util::LoadDatFile(in_stack_fffffffffffff828,in_stack_fffffffffffff824,in_stack_fffffffffffff820);
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator(&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (allocator<char> *)in_stack_fffffffffffff400);
  Util::LoadDatFile(in_stack_fffffffffffff828,in_stack_fffffffffffff824,in_stack_fffffffffffff820);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_fffffffffffff3d8,(Index)in_stack_fffffffffffff3d0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff3d0,
             in_stack_fffffffffffff3c8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff400,
             (Scalar *)in_stack_fffffffffffff3f8,&in_stack_fffffffffffff3f0->mu_,
             in_stack_fffffffffffff3e8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff400,
             (Scalar *)in_stack_fffffffffffff3f8,&in_stack_fffffffffffff3f0->mu_,
             in_stack_fffffffffffff3e8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff400,
             (Scalar *)in_stack_fffffffffffff3f8,&in_stack_fffffffffffff3f0->mu_,
             in_stack_fffffffffffff3e8);
  local_3c8 = 0xbfb999999999999a;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x105b95);
  for (local_7a4 = 0; local_7a4 < 0x71; local_7a4 = local_7a4 + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffff3d0,(Index)in_stack_fffffffffffff3c8,0x105bca);
    local_3d8 = *pSVar3;
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff410,
               (Index)in_stack_fffffffffffff408,(Index)in_stack_fffffffffffff400,
               (int)((ulong)in_stack_fffffffffffff3f8 >> 0x20),(int)in_stack_fffffffffffff3f8);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              in_stack_fffffffffffff3d0);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
               (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                *)in_stack_fffffffffffff3c8);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff410,
               (Index)in_stack_fffffffffffff408,(Index)in_stack_fffffffffffff400,
               (int)((ulong)in_stack_fffffffffffff3f8 >> 0x20),(int)in_stack_fffffffffffff3f8);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              in_stack_fffffffffffff3d0);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
               (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                *)in_stack_fffffffffffff3c8);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x105cb1);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x105cc0);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffff3d0,(Index)in_stack_fffffffffffff3c8,0x105d0a);
    dVar4 = *pSVar3;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8);
    std::operator<<((ostream *)&std::cout,"Pos1: \n");
    poVar1 = Eigen::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cout,"Pos2: \n");
    poVar1 = Eigen::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"Pos1 + tof*Vel1: \n");
    Eigen::operator*((double *)poVar1,(StorageBaseType *)in_stack_fffffffffffff410);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff3f8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffff3f0);
    in_stack_fffffffffffff410 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Eigen::operator<<((ostream *)in_stack_fffffffffffff630,
                           (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                            *)in_stack_fffffffffffff628);
    std::operator<<((ostream *)in_stack_fffffffffffff410,"\n");
    in_stack_fffffffffffff408 = std::operator<<((ostream *)&std::cout,"tof: ");
    in_stack_fffffffffffff400 =
         (ostream *)std::ostream::operator<<(in_stack_fffffffffffff408,dVar4 / 299792.0);
    std::operator<<(in_stack_fffffffffffff400,"\n");
    in_stack_fffffffffffff3f8 = std::operator<<((ostream *)&std::cout,"Pos1 + tof*Vel1 - Pos2: \n");
    Eigen::operator*((double *)poVar1,(StorageBaseType *)in_stack_fffffffffffff410);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff3f8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffff3f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
    ::operator-((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                 *)in_stack_fffffffffffff3f8,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff3f0);
    in_stack_fffffffffffff3f0 =
         (EGM96Grav *)
         Eigen::operator<<((ostream *)in_stack_fffffffffffff630,
                           (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)in_stack_fffffffffffff628);
    std::operator<<((ostream *)in_stack_fffffffffffff3f0,"\n");
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffff3d0,(Index)in_stack_fffffffffffff3c8,0x105f71);
    in_stack_fffffffffffff3e4 = (int)*pSVar3;
    local_a04 = in_stack_fffffffffffff3e4;
    if (in_stack_fffffffffffff3e4 == 1) {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8);
    }
    else if (in_stack_fffffffffffff3e4 == 2) {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8);
    }
    else if (in_stack_fffffffffffff3e4 == 3) {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8);
    }
    else {
      std::operator<<((ostream *)&std::cout,"Error: bad case in measurement \n");
    }
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffff3d0,(Index)in_stack_fffffffffffff3c8,0x106216);
    local_3d8 = *pSVar3;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3d0,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff3c8);
    VehicleState::Propagator::GetRangeAndRate
              (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff410,
               (Index)in_stack_fffffffffffff408,(Index)in_stack_fffffffffffff400,
               (int)((ulong)in_stack_fffffffffffff3f8 >> 0x20),(int)in_stack_fffffffffffff3f8);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
               in_stack_fffffffffffff3d0,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)in_stack_fffffffffffff3c8);
  }
  this = (EGM96Grav *)local_a89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (allocator<char> *)in_stack_fffffffffffff400);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)this,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff3c8);
  Util::Eigen2csv(in_stack_fffffffffffff630,(MatrixXd *)in_stack_fffffffffffff628);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x106334);
  std::__cxx11::string::~string((string *)(local_a89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a89);
  local_4 = 0;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x106366);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x106373);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x106380);
  Util::EGM96Grav::~EGM96Grav(this);
  VehicleState::Propagator::~Propagator((Propagator *)0x10639a);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x1063a7);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x1063b4);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x1063ce);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x1063db);
  return local_4;
}

Assistant:

int main() {

	//////////////// Test ECI to ECEF //////////////////

	//precision
	std::cout << std::setprecision(17);

	//initialize position and time
	Eigen::Vector3d pos_ECEF(-28738.3218400000, -30844.0723200000, -6.71800000000000);

	//target position
	Eigen::Vector3d targ_pos_ECI(19165.44514777874, -37549.06140374086, -41.043609948282580);

	//load some data files
	Eigen::MatrixXd nut80 = Util::LoadDatFile("../data/nut80.csv", 106, 10);
	Eigen::MatrixXd iau1980 = Util::LoadDatFile("../data/iau1980modified.csv",17563, 5);

	//check Julian date algorithm
	double t_JD = Util::JulianDateNatural2JD(2017.0, 12.0, 1.0, 0.0, 0.0, 48.0000384);

	std::cout << "Julian Date: " << t_JD << "\n";

	// get rotation matrix
	std::vector<Eigen::Matrix3d> matvec(5, Eigen::Matrix3d::Identity(3,3));
	Eigen::Matrix3d R = Util::ECEF2ECI(t_JD, &nut80, &iau1980, &matvec);

	//rotate
	Eigen::Vector3d pos_ECI = R*pos_ECEF;

	//error
	std::cout << "Error [cm]: \n" << 100.0*1000.0*(targ_pos_ECI - pos_ECI) << "\n";

	//load the test times
	Eigen::MatrixXd t_R_test = Util::LoadDatFile("../data/t_ECF_test.csv",865,1);

	//load test position
	// Eigen::MatrixXd r_ECF_test = Util::LoadDatFile("../data/r_ECF_test.csv",1,3);
	Eigen::Vector3d pos_ECEF2(6378.136300000000, 6378.136300000000, 6378.136300000000);

	std::cout << "ECEF Test Position: \n" << pos_ECEF2 << "\n";

	//reset julian date to project epoch
	t_JD = Util::JulianDateNatural2JD(2018.0, 3.0, 23.0, 8.0, 55.0, 3.0);

	//initialize ECI matrix
	Eigen::MatrixXd pos_ECI2 = Eigen::MatrixXd::Zero(3,865);

	//perform rotations
	for (int i = 0; i < 865; ++i)	{
		R = Util::ECEF2ECI(t_JD + t_R_test(i,0)/(24.0*60.0*60.0), &nut80, &iau1980, &matvec);
		pos_ECI2.block(0,i,3,1) = R*pos_ECEF2;
	}

	//save data
	Util::Eigen2csv("../data/pred_ECIpos.csv", pos_ECI2);


	// exit(0);s
	////////////////////////////////////////////////////


	///////////////// Test Propagator /////////////////////

	//form a propagator object
	VehicleState::Propagator propobj;

	//set physics constants
	propobj.mu_ = 398600.4415; // km^3/sec^2
	propobj.mu_sun_ = 132712440018.0; //km^3/sec^2
	propobj.mu_moon_ = 4902.800066; //km^3/sec^2
	propobj.AU_ = 149597870.7;
	propobj.J2_ = 0.00108248;
	propobj.J3_ = 0.0000025327;
	propobj.Rearth_ = 6378.1363; //km
	propobj.earthrotationspeed_ = 7.292115146706979 * pow(10.0,-5.0); // rad/sec
	propobj.C_D_ = 1.88;
	propobj.A_ = 15; // m^2
	propobj.m_ = 2000.0; //kg
	propobj.rho_0_ = 3.614*pow(10.0,-13.0); //kg/m^3
	propobj.r0_ = 700.0 + propobj.Rearth_; //km
	propobj.H_ = 88.6670; //km

	//parameters
	propobj.useJ2_ = false;
	propobj.use20x20_ = true;
	propobj.usedrag_ = false;
	propobj.useSRP_ = false;
	propobj.useLuniSolar_ = false; //gravity of sun and moon

	//form a gravity object
	Util::EGM96Grav gravmodel;
	gravmodel.LoadNormCoeffs("../data/egm96_C_normalized.csv", "../data/egm96_S_normalized.csv");
	gravmodel.NormCoeffs2Reg();
	gravmodel.mu_ = propobj.mu_;
	gravmodel.Rearth_ = propobj.Rearth_;
	gravmodel.nut80ptr_ = &nut80; 
	gravmodel.iau1980ptr_ = &iau1980;
	propobj.gravmodel_ = &gravmodel;

	//set objects position and velocity (from lighttime_truth.mat)
	Eigen::Vector3d pos0;
	pos0[0] = 6984.46459301679;
	pos0[1] = 1612.22237259524;
	pos0[2] = 13.0914313353482;

	Eigen::Vector3d vel0;
	vel0[0] = -1.67664476668291;
	vel0[1] = 7.26144494619245;
	vel0[2] =  0.259889921085112;

	//set objects position and velocity (from HW5 assignment)
	// Eigen::Vector3d pos0;
	// pos0[0] = 6990077.798814194;
	// pos0[1] = 1617465.311978378;
	// pos0[2] = 22679.810569245355;
	// pos0 = pos0/1000.0; //convert units

	// Eigen::Vector3d vel0;
	// vel0[0] = -1675.13972506056;
	// vel0[1] = 7273.72441330686;
	// vel0[2] =  252.688512916741;
	// vel0 = vel0/1000.0; //convert units

	propobj.pos_ = pos0;
	propobj.vel_ = vel0;

	propobj.t_JD_ = Util::JulianDateNatural2JD(2018.0, 2.0, 1.0, 5.0, 0.0, 0.0);

	//set tolerance options
	propobj.abstol_ = 1.0*pow(10.0,-16.0);
	propobj.reltol_ = 3.0*pow(10.0,-14.0);
	propobj.dt_var_ = 0.1;

	// propagate
	// propobj.Propagate(21600.0, false);

	//true final position and velocity

	//lighttime_truth.mat
	// Eigen::Vector3d posf_true(-5153.82535324096, -4954.3861758395, -144.823727065817);
	// Eigen::Vector3d velf_true(5.17802136652852, -5.38752135424995, -0.211929233793885);

	// .xlsx file (20x20 only)
	Eigen::Vector3d posf_true(-5153.77192464701, -4954.43582198601, -144.832817220038);
	Eigen::Vector3d velf_true(5.17808108556007, -5.38747088174872, -0.211928868806419);

	//output
	// std::cout << "Final Position:\n" << propobj.pos_ << "\n" << "Error [m]:\n" << 1000.0*(propobj.pos_ - posf_true) << "\n";
	// std::cout << "Final Velocity:\n" << propobj.vel_ << "\n" << "Error [m/sec]:\n" << 1000.0*(propobj.vel_ - velf_true) << "\n";

	//////////////////////////////////////////////////////////////

	//////////////// Test Measurement Predictions /////////////////////

	//simple propagation
	propobj.useJ2_ = true;
	propobj.use20x20_ = true;
	propobj.usedrag_ = true;
	propobj.useSRP_ = true;
	propobj.useLuniSolar_ = true; //gravity of sun and moon

	// load true state and measurements
	Eigen::MatrixXd lighttime_truth = Util::LoadDatFile("../data/lighttime_truth.csv",113, 7);
	Eigen::MatrixXd true_meas = Util::LoadDatFile("../data/LEO_Data_Apparent.csv",113, 4);
	//initialize predicted measurements
	Eigen::MatrixXd pred_meas = Eigen::MatrixXd::Zero(2,113);

	//set observation station ECEF location
	Eigen::Vector3d obs_station1{-6143.584, 1364.250, 1033.743}; //atoll / Kwajalein
	Eigen::Vector3d obs_station2{1907.295, 6030.810, -817.119}; //diego garcia
	Eigen::Vector3d obs_station3{2390.310, -5564.341, 1994.578}; //arecibo

	double c = 299792.0; //speed of light km/sec

	propobj.dt_var_ = -0.1; //only doing backwards props

	//vector for use with choosing station
	Eigen::Vector3d obs_station_iter;

	// cycle through all the measurements, create a predicted measurement at each
	for (int i = 0; i < 113; ++i){
		
		//set time of object
		propobj.t_ = lighttime_truth(i,6);

		//set true state of object
		propobj.pos_ = lighttime_truth.block(i,0,1,3).transpose();
		propobj.vel_ = lighttime_truth.block(i,3,1,3).transpose();

		Eigen::Vector3d pos1;
		Eigen::Vector3d vel1;
		Eigen::Vector3d pos2 = propobj.pos_;
		Eigen::Vector3d vel2 = propobj.vel_;

		//approximate tof
		double tof = true_meas(i,2)/c;

		//propagate backwards in time to measurement
		// propobj.Propagate(-1.0*tof,false);

		pos1 = propobj.pos_;
		vel1 = propobj.vel_;

		std::cout << "Pos1: \n" << pos1 << "\n";
		std::cout << "Pos2: \n" << pos2 << "\n";
		std::cout << "Pos1 + tof*Vel1: \n" << pos1 + tof*vel1 << "\n";
		std::cout << "tof: " << tof << "\n";
		std::cout << "Pos1 + tof*Vel1 - Pos2: \n" << pos1 + tof*vel1 - pos2 << "\n";	

		//determine which tracking station was used
		int stationID = (int) true_meas(i, 0);

		switch(stationID) {
			case 1:
				obs_station_iter = obs_station1;
				break;

			case 2:
				obs_station_iter = obs_station2;
				break;

			case 3:
				obs_station_iter = obs_station3;
				break;

			default: std::cout << "Error: bad case in measurement \n";
		}

		//reset time
		propobj.t_ = lighttime_truth(i,6);

		//approximate measurement
		pred_meas.block(0,i,2,1) = propobj.GetRangeAndRate(obs_station_iter, 1.0*tof);

		// for (int j = 0; j < 5; ++j){

		// 	//approximate measurement
		// 	pred_meas.block(0,i,2,1) = propobj.GetRangeAndRate(obs_station_iter, 1.0*tof);

		// 	std::cout << "Change in ToF: " << tof - pred_meas(0,i)/c << "\n";

		// 	//reset time of flight
		// 	tof = pred_meas(0,i)/c;
		// }
		

		// exit(0);

	}

	//write out the predicted measurements
	Util::Eigen2csv("../data/pred_meas.csv", pred_meas);

	return 0;
}